

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerAdapter::OnBeginFunctionCall
          (cmDebuggerAdapter *this,cmMakefile *mf,string *sourcePath,cmListFileFunction *lff)

{
  bool bVar1;
  element_type *peVar2;
  long lVar3;
  pointer this_00;
  size_type __new_size;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  size_t sVar7;
  pointer this_01;
  pointer this_02;
  undefined1 local_170 [8];
  array<dap::integer> hitBreakpoints;
  bool local_149;
  undefined1 local_148 [8];
  StoppedEvent stoppedEvent;
  undefined1 local_90 [7];
  bool waitSem;
  vector<long,_std::allocator<long>_> hits;
  undefined1 local_68 [8];
  unique_lock<std::mutex> lock;
  cmListFileFunction *lff_local;
  string *sourcePath_local;
  cmMakefile *mf_local;
  cmDebuggerAdapter *this_local;
  memory_order __b_1;
  memory_order __b;
  
  lock._8_8_ = lff;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_68,&this->Mutex);
  peVar2 = std::
           __shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->DefaultThread);
  cmDebuggerThread::PushStackFrame(peVar2,mf,sourcePath,(cmListFileFunction *)lock._8_8_);
  lVar3 = cmListFileFunction::Line((cmListFileFunction *)lock._8_8_);
  if (lVar3 == 0) {
    hits.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
    goto LAB_004963f8;
  }
  this_00 = std::
            unique_ptr<cmDebugger::cmDebuggerBreakpointManager,_std::default_delete<cmDebugger::cmDebuggerBreakpointManager>_>
            ::operator->(&this->BreakpointManager);
  lVar3 = cmListFileFunction::Line((cmListFileFunction *)lock._8_8_);
  cmDebuggerBreakpointManager::GetBreakpoints
            ((vector<long,_std::allocator<long>_> *)local_90,this_00,sourcePath,lVar3);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_68);
  stoppedEvent.threadId._15_1_ = 0;
  dap::StoppedEvent::StoppedEvent((StoppedEvent *)local_148);
  local_149 = true;
  dap::optional<dap::boolean>::operator=((optional<dap::boolean> *)local_148,&local_149);
  peVar2 = std::
           __shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->DefaultThread);
  hitBreakpoints.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)cmDebuggerThread::GetId(peVar2);
  dap::optional<dap::integer>::operator=
            ((optional<dap::integer> *)&stoppedEvent.text.set,
             (long *)&hitBreakpoints.super__Vector_base<dap::integer,_std::allocator<dap::integer>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::vector<long,_std::allocator<long>_>::empty
                    ((vector<long,_std::allocator<long>_> *)local_90);
  if (!bVar1) {
    ClearStepRequests(this);
    stoppedEvent.threadId._15_1_ = 1;
    std::vector<dap::integer,_std::allocator<dap::integer>_>::vector
              ((vector<dap::integer,_std::allocator<dap::integer>_> *)local_170);
    __new_size = std::vector<long,_std::allocator<long>_>::size
                           ((vector<long,_std::allocator<long>_> *)local_90);
    std::vector<dap::integer,_std::allocator<dap::integer>_>::resize
              ((vector<dap::integer,_std::allocator<dap::integer>_> *)local_170,__new_size);
    iVar4 = std::vector<long,_std::allocator<long>_>::begin
                      ((vector<long,_std::allocator<long>_> *)local_90);
    iVar5 = std::vector<long,_std::allocator<long>_>::end
                      ((vector<long,_std::allocator<long>_> *)local_90);
    iVar6 = std::vector<dap::integer,_std::allocator<dap::integer>_>::begin
                      ((vector<dap::integer,_std::allocator<dap::integer>_> *)local_170);
    std::
    transform<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<dap::integer*,std::vector<dap::integer,std::allocator<dap::integer>>>,cmDebugger::cmDebuggerAdapter::OnBeginFunctionCall(cmMakefile*,std::__cxx11::string_const&,cmListFileFunction_const&)::__0>
              (iVar4._M_current,iVar5._M_current,iVar6._M_current);
    std::__cxx11::string::operator=((string *)&stoppedEvent.preserveFocusHint,"breakpoint");
    dap::optional<std::vector<dap::integer,std::allocator<dap::integer>>>::operator=
              ((optional<std::vector<dap::integer,std::allocator<dap::integer>>> *)
               &stoppedEvent.description.set,
               (vector<dap::integer,_std::allocator<dap::integer>_> *)local_170);
    std::vector<dap::integer,_std::allocator<dap::integer>_>::~vector
              ((vector<dap::integer,_std::allocator<dap::integer>_> *)local_170);
  }
  peVar2 = std::
           __shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->DefaultThread);
  sVar7 = cmDebuggerThread::GetStackFrameSize(peVar2);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (((long)sVar7 <= (this->NextStepFrom).super___atomic_base<long>._M_i) ||
     (bVar1 = std::atomic<bool>::load(&this->StepInRequest,memory_order_seq_cst), bVar1)) {
LAB_0049631d:
    ClearStepRequests(this);
    stoppedEvent.threadId._15_1_ = 1;
    std::__cxx11::string::operator=((string *)&stoppedEvent.preserveFocusHint,"step");
  }
  else {
    peVar2 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->DefaultThread);
    sVar7 = cmDebuggerThread::GetStackFrameSize(peVar2);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    if ((long)sVar7 <= (this->StepOutDepth).super___atomic_base<long>._M_i) goto LAB_0049631d;
  }
  bVar1 = std::atomic<bool>::load(&this->PauseRequest,memory_order_seq_cst);
  if (bVar1) {
    ClearStepRequests(this);
    stoppedEvent.threadId._15_1_ = 1;
    std::__cxx11::string::operator=((string *)&stoppedEvent.preserveFocusHint,"pause");
  }
  if ((stoppedEvent.threadId._15_1_ & 1) != 0) {
    this_01 = std::unique_ptr<dap::Session,_std::default_delete<dap::Session>_>::operator->
                        (&this->Session);
    dap::Session::send<dap::StoppedEvent,void>(this_01,(StoppedEvent *)local_148);
    this_02 = std::unique_ptr<cmDebugger::Semaphore,_std::default_delete<cmDebugger::Semaphore>_>::
              operator->(&this->ContinueSem);
    Semaphore::Wait(this_02);
  }
  dap::StoppedEvent::~StoppedEvent((StoppedEvent *)local_148);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_90)
  ;
  hits.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
LAB_004963f8:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  return;
}

Assistant:

void cmDebuggerAdapter::OnBeginFunctionCall(cmMakefile* mf,
                                            std::string const& sourcePath,
                                            cmListFileFunction const& lff)
{
  std::unique_lock<std::mutex> lock(Mutex);
  DefaultThread->PushStackFrame(mf, sourcePath, lff);

  if (lff.Line() == 0) {
    // File just loaded, continue to first valid function call.
    return;
  }

  auto hits = BreakpointManager->GetBreakpoints(sourcePath, lff.Line());
  lock.unlock();

  bool waitSem = false;
  dap::StoppedEvent stoppedEvent;
  stoppedEvent.allThreadsStopped = true;
  stoppedEvent.threadId = DefaultThread->GetId();
  if (!hits.empty()) {
    ClearStepRequests();
    waitSem = true;

    dap::array<dap::integer> hitBreakpoints;
    hitBreakpoints.resize(hits.size());
    std::transform(hits.begin(), hits.end(), hitBreakpoints.begin(),
                   [&](const int64_t& id) { return dap::integer(id); });
    stoppedEvent.reason = "breakpoint";
    stoppedEvent.hitBreakpointIds = hitBreakpoints;
  }

  if (long(DefaultThread->GetStackFrameSize()) <= NextStepFrom.load() ||
      StepInRequest.load() ||
      long(DefaultThread->GetStackFrameSize()) <= StepOutDepth.load()) {
    ClearStepRequests();
    waitSem = true;

    stoppedEvent.reason = "step";
  }

  if (PauseRequest.load()) {
    ClearStepRequests();
    waitSem = true;

    stoppedEvent.reason = "pause";
  }

  if (waitSem) {
    Session->send(stoppedEvent);
    ContinueSem->Wait();
  }
}